

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

long __thiscall FileReaderLZMA::Read(FileReaderLZMA *this,void *buffer,long len)

{
  size_t sVar1;
  SRes SVar2;
  ELzmaStatus *unaff_retaddr;
  size_t in_processed;
  size_t out_processed;
  ELzmaStatus status;
  ELzmaFinishMode finish_mode;
  Byte *next_out;
  int err;
  long len_local;
  void *buffer_local;
  FileReaderLZMA *this_local;
  
  sVar1 = this->InSize;
  in_processed._4_4_ = (ELzmaFinishMode)((ulong)len >> 0x20);
  SVar2 = LzmaDec_DecodeToBuf((CLzmaDec *)buffer,(Byte *)len,
                              (SizeT *)CONCAT44(next_out._4_4_,next_out._0_4_),(Byte *)buffer,
                              (SizeT *)(ulong)(uint)out_processed,in_processed._4_4_,unaff_retaddr);
  this->InPos = sVar1 + this->InPos;
  this->InSize = this->InSize - sVar1;
  if (SVar2 != 0) {
    I_Error("Corrupt LZMA stream");
  }
  if (((sVar1 == 0) && (len == 0)) && ((uint)out_processed != 1)) {
    I_Error("Corrupt LZMA stream");
  }
  if ((this->InSize == 0) && ((this->SawEOF & 1U) == 0)) {
    FillBuffer(this);
  }
  if ((SVar2 != 0) && (SVar2 != 1)) {
    I_Error("Corrupt LZMA stream");
  }
  return len;
}

Assistant:

long FileReaderLZMA::Read (void *buffer, long len)
{
	int err;
	Byte *next_out = (Byte *)buffer;

	do
	{
		ELzmaFinishMode finish_mode = LZMA_FINISH_ANY;
		ELzmaStatus status;
		size_t out_processed = len;
		size_t in_processed = InSize;

		err = LzmaDec_DecodeToBuf(&Streamp->Stream, next_out, &out_processed, InBuff + InPos, &in_processed, finish_mode, &status);
		InPos += in_processed;
		InSize -= in_processed;
		next_out += out_processed;
		len = (long)(len - out_processed);
		if (err != SZ_OK)
		{
			I_Error ("Corrupt LZMA stream");
		}
		if (in_processed == 0 && out_processed == 0)
		{
			if (status != LZMA_STATUS_FINISHED_WITH_MARK)
			{
				I_Error ("Corrupt LZMA stream");
			}
		}
		if (InSize == 0 && !SawEOF)
		{
			FillBuffer ();
		}
	} while (err == SZ_OK && len != 0);

	if (err != Z_OK && err != Z_STREAM_END)
	{
		I_Error ("Corrupt LZMA stream");
	}

	if (len != 0)
	{
		I_Error ("Ran out of data in LZMA stream");
	}

	return (long)(next_out - (Byte *)buffer);
}